

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::iterator::insert
          (iterator *this,unsigned_long left,unsigned_long right,NetAlias **value,
          allocator_type *alloc)

{
  Path *this_00;
  IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U> *this_01;
  pointer pEVar1;
  size_type sVar2;
  int iVar3;
  uint32_t uVar4;
  uintptr_t intWord;
  IndexPair offset;
  uint uVar5;
  uint level;
  interval<unsigned_long> ival;
  interval<unsigned_long> local_40;
  
  this_01 = (this->super_const_iterator).map;
  this_00 = &(this->super_const_iterator).path;
  local_40.left = left;
  local_40.right = right;
  if (this_01->height == 0) {
    uVar4 = IntervalMapDetails::
            LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_true>::insertFrom
                      ((LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_true>
                        *)this_01,
                       (this->super_const_iterator).path.path.
                       super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                       [(this->super_const_iterator).path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                       offset,this_01->rootSize,&local_40,value);
    if (uVar4 < 9) {
      this_01->rootSize = uVar4;
      ((this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->size =
           uVar4;
      return;
    }
    offset = IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>::
             modifyRoot<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Compilation::NetAlias_const*,8u,true>,slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Compilation::NetAlias_const*,8u,false>,true>
                       ((IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u> *)
                        this_01,(LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_true>
                                 *)this_01,
                        (this->super_const_iterator).path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                        [(this->super_const_iterator).path.path.
                         super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                        offset,alloc);
    IntervalMapDetails::Path::
    replaceRoot<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,true>>
              (this_00,(BranchNode<unsigned_long,_8U,_true> *)this_01,this_01->rootSize,offset);
  }
  if (((this->super_const_iterator).path.path.
       super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len == 0) ||
     (pEVar1 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     pEVar1->size <= pEVar1->offset)) {
    IntervalMapDetails::Path::legalizeForInsert(this_00,((this->super_const_iterator).map)->height);
  }
  pEVar1 = (this->super_const_iterator).path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  sVar2 = (this->super_const_iterator).path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  uVar4 = IntervalMapDetails::
          LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_false>::insertFrom
                    ((LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_false>
                      *)pEVar1[sVar2 - 1].node,pEVar1[sVar2 - 1].offset,pEVar1[sVar2 - 1].size,
                     &local_40,value);
  if (8 < uVar4) {
    IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>::iterator::
    overflow<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Compilation::NetAlias_const*,8u,false>>
              ((iterator *)this,
               (int)(this->super_const_iterator).path.path.
                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1,alloc);
    pEVar1 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    sVar2 = (this->super_const_iterator).path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
    uVar4 = IntervalMapDetails::
            LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_false>::
            insertFrom((LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_false>
                        *)pEVar1[sVar2 - 1].node,pEVar1[sVar2 - 1].offset,pEVar1[sVar2 - 1].size,
                       &local_40,value);
  }
  pEVar1 = (this->super_const_iterator).path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  iVar3 = (int)(this->super_const_iterator).path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  level = iVar3 - 1;
  pEVar1[level].size = uVar4;
  if (level != 0) {
    uVar5 = iVar3 - 2;
    *(ulong *)((long)pEVar1[uVar5].node + (ulong)pEVar1[uVar5].offset * 8) =
         *(ulong *)((long)pEVar1[uVar5].node + (ulong)pEVar1[uVar5].offset * 8) & 0xffffffffffffffc0
         | (ulong)(uVar4 - 1);
  }
  updateParentBounds(this,level,&local_40);
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::insert(TKey left, TKey right, const TValue& value,
                                                    allocator_type& alloc) {
    using namespace IntervalMapDetails;

    auto& map = *this->map;
    auto& path = this->path;

    interval<TKey> ival{left, right};
    if (this->isFlat()) {
        // Try simple root leaf insert first.
        uint32_t size = map.rootLeaf.insertFrom(path.leafOffset(), map.rootSize, ival, value);
        if (size <= RootLeaf::Capacity) {
            map.rootSize = size;
            path.setSize(0, size);
            return;
        }

        // Root is full, we need to branch.
        auto offset = map.switchToBranch(path.leafOffset(), alloc);
        path.replaceRoot(&map.rootBranch, map.rootSize, offset);
    }

    if (!path.valid())
        path.legalizeForInsert(this->map->height);

    uint32_t size = path.leafSize();
    size = path.template leaf<Leaf>().insertFrom(path.leafOffset(), size, ival, value);

    if (size > Leaf::Capacity) {
        // If the new element didn't fit, overflow the node and try again.
        overflow<Leaf>(path.height(), alloc);
        size = path.template leaf<Leaf>().insertFrom(path.leafOffset(), path.leafSize(), ival,
                                                     value);
    }

    // Update path to match the newly inserted element.
    path.setSize(path.height(), size);
    updateParentBounds(path.height(), ival);
}